

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<double,float,int(*)(char_const**,double*)>
               (float num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  float fVar7;
  uint extraout_EDX;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  byte *pbVar11;
  code *pcVar12;
  char cVar13;
  undefined8 unaff_R12;
  undefined8 uVar14;
  undefined *puVar15;
  char *pcVar16;
  double num2;
  char *mp_num_pos2;
  char str [256];
  char mp_nums [16] [16];
  double dStack_480;
  undefined1 *puStack_478;
  char acStack_470 [256];
  undefined1 uStack_370;
  undefined8 uStack_36f;
  undefined1 auStack_367 [255];
  _func_int_char_ptr_ptr_double_ptr *p_Stack_268;
  undefined8 uStack_260;
  undefined *puStack_258;
  code *pcStack_250;
  double local_248;
  byte *local_240;
  char local_238 [256];
  byte local_138 [16];
  byte local_128 [248];
  
  builtin_strncpy(local_238,"typed read of ",0xf);
  uVar14 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  pcStack_250 = (code *)0x13932e;
  iVar3 = snprintf(local_238 + 0xe,0xf2,"%f",0x41590b2200000000);
  pcVar16 = local_238 + (long)iVar3 + 0xe;
  pcStack_250 = (code *)0x13934f;
  iVar3 = snprintf(pcVar16,(size_t)(local_138 + -(long)pcVar16)," into ");
  pcStack_250 = (code *)0x139369;
  snprintf(pcVar16 + iVar3,(size_t)(local_138 + -(long)(pcVar16 + iVar3)),"double");
  puVar15 = &stdout;
  pcStack_250 = (code *)0x139378;
  _space((FILE *)_stdout);
  pcStack_250 = (code *)0x139391;
  fwrite("# ",2,1,_stdout);
  pcStack_250 = (code *)0x13939e;
  fputs(local_238,_stdout);
  pcVar12 = (code *)0xa;
  pcStack_250 = (code *)0x1393ab;
  fputc(10,_stdout);
  local_138[0] = 0xca;
  local_138[1] = 0x4a;
  local_138[2] = 200;
  local_138[3] = 0x59;
  local_138[4] = 0x10;
  local_128[0] = 0xcb;
  local_128[1] = 0x41;
  local_128[2] = 0x59;
  local_128[3] = 0xb;
  local_128[4] = 0x22;
  local_128[5] = 0;
  local_128[6] = 0;
  local_128[7] = 0;
  local_128[8] = 0;
  pbVar4 = local_138;
  do {
    bVar5 = *pbVar4;
    uVar8 = (ulong)bVar5;
    mVar1 = mp_type_hint[uVar8];
    if (mVar1 == MP_UINT) {
      if (bVar5 == 0xce) {
        uVar6 = *(uint *)(pbVar4 + 1);
        uVar9 = (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                       uVar6 << 0x18);
        pbVar11 = pbVar4 + 5;
LAB_001394a6:
        if (uVar9 == 0x642c88) goto LAB_001394cd;
      }
      else {
        if (bVar5 == 0xcf) {
          uVar9 = *(ulong *)(pbVar4 + 1);
          uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                  | uVar9 << 0x38;
          pbVar11 = pbVar4 + 9;
          goto LAB_001394a6;
        }
        if ((1 < bVar5 - 0xcc) && ((char)bVar5 < '\0')) {
          pcStack_250 = (code *)0x139617;
          test_read_num<double,float,int(*)(char_const**,double*)>();
          goto LAB_00139617;
        }
      }
      pcStack_250 = (code *)0x1395b5;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      bVar5 = (byte)uVar8;
      uVar6 = extraout_EDX;
LAB_001395b5:
      if ((1 < uVar6 - 0xd0) && (bVar5 < 0xe0)) {
LAB_00139617:
        pcStack_250 = test_read_num<double,double,int(*)(char_const**,double*)>;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        builtin_strncpy(acStack_470,"typed read of ",0xf);
        p_Stack_268 = read_f;
        uStack_260 = uVar14;
        puStack_258 = puVar15;
        pcStack_250 = (code *)local_128;
        iVar3 = snprintf(acStack_470 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
        pcVar16 = acStack_470 + (long)iVar3 + 0xe;
        iVar3 = snprintf(pcVar16,(size_t)(&uStack_370 + -(long)pcVar16)," into ");
        snprintf(pcVar16 + iVar3,(size_t)(&uStack_370 + -(long)(pcVar16 + iVar3)),"double");
        _space((FILE *)_stdout);
        fwrite("# ",2,1,_stdout);
        fputs(acStack_470,_stdout);
        fputc(10,_stdout);
        puStack_478 = &uStack_370;
        uStack_370 = 0xcb;
        uStack_36f = 0xb81e85eb513816c0;
        dStack_480 = 0.0;
        iVar3 = (*pcVar12)(&puStack_478,&dStack_480);
        _ok((uint)(iVar3 == 0),"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",0xffffffcb);
        _ok((uint)(auStack_367 == puStack_478),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        _ok((uint)(ABS(-5.555 - dStack_480) < 1e-15),"double_eq(num1, num2)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73e,"check float number");
        return;
      }
LAB_001395c5:
      pcStack_250 = (code *)0x1395ca;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
      pcStack_250 = (code *)0x1395cf;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
      pcStack_250 = (code *)0x1395ee;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    if (mVar1 == MP_FLOAT) {
      if (bVar5 != 0xca) {
LAB_001395f3:
        pcStack_250 = (code *)0x139612;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar6 = *(uint *)(pbVar4 + 1);
      fVar7 = (float)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                     uVar6 << 0x18);
      if ((fVar7 == 6.565e+06) && (!NAN(fVar7))) {
        pbVar11 = pbVar4 + 5;
        goto LAB_001394cd;
      }
      goto LAB_001395ca;
    }
    if (mVar1 == MP_INT) {
      if (bVar5 != 0xd2) {
        uVar6 = (uint)bVar5;
        if (bVar5 == 0xd3) {
          uVar8 = *(ulong *)(pbVar4 + 1);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          pbVar11 = pbVar4 + 9;
          goto LAB_001394c0;
        }
        goto LAB_001395b5;
      }
      uVar6 = *(uint *)(pbVar4 + 1);
      pbVar11 = pbVar4 + 5;
      uVar8 = (ulong)(int)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                          uVar6 << 0x18);
LAB_001394c0:
      if (uVar8 == 0x642c88) goto LAB_001394cd;
      goto LAB_001395c5;
    }
    if (bVar5 != 0xcb) goto LAB_001395cf;
    uVar8 = *(ulong *)(pbVar4 + 1);
    dVar10 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
    if ((dVar10 != 6565000.0) || (NAN(dVar10))) {
      pcStack_250 = (code *)0x1395f3;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_001395f3;
    }
    pbVar11 = pbVar4 + 9;
LAB_001394cd:
    puVar15 = (undefined *)(ulong)(uint)(int)(char)bVar5;
    local_248 = 0.0;
    pcStack_250 = (code *)0x1394e8;
    local_240 = pbVar4;
    iVar3 = (*read_f)((char **)&local_240,&local_248);
    pcStack_250 = (code *)0x139510;
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",puVar15);
    pcStack_250 = (code *)0x139538;
    _ok((uint)(pbVar11 == local_240),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar2 = ABS(6565000.0 - local_248) < 1e-15;
    pcVar12 = (code *)(ulong)bVar2;
    pcStack_250 = (code *)0x13957c;
    _ok((uint)bVar2,"double_eq(num1, num2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73e,"check float number");
    cVar13 = (char)uVar14;
    uVar14 = 0;
    pbVar4 = local_128;
    if (cVar13 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}